

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O0

bool __thiscall
assembler::SessionPDU::append(SessionPDU *this,const_iterator begin,const_iterator end)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  difference_type dVar5;
  uint *puVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_01;
  void *source;
  reference sourceLen;
  SZ_com_t *param;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_02;
  uchar *in_RSI;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RDI;
  int rv;
  size_t dataInLen;
  uint8_t *dataIn;
  size_t outLen;
  uint8_t *out;
  size_t len_1;
  size_t len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe78;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffe80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffea8;
  Buffer *in_stack_fffffffffffffeb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffec8;
  const_iterator in_stack_fffffffffffffed8;
  SessionPDU *in_stack_fffffffffffffef8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *destLen;
  void *in_stack_ffffffffffffff30;
  uint local_80;
  uint local_7c;
  ulong local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  uchar *local_58;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  uint local_30;
  uint local_2c;
  ulong local_28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_10;
  bool local_1;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_10._M_current = in_RSI;
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (in_RDI._M_current + 8));
  if (sVar4 < 0x10) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (in_RDI._M_current + 8));
    local_2c = 0x10 - (int)sVar4;
    dVar5 = __gnu_cxx::operator-
                      (in_stack_fffffffffffffe80,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffe78);
    local_30 = (uint)dVar5;
    puVar6 = std::min<unsigned_int>(&local_2c,&local_30);
    local_28 = (ulong)*puVar6;
    in_stack_fffffffffffffec8._M_current = in_RDI._M_current + 8;
    local_40 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  (in_stack_fffffffffffffe78);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_fffffffffffffe80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe78);
    local_48 = local_10._M_current;
    local_50 = (uchar *)__gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(in_stack_fffffffffffffe88,
                                    (difference_type)in_stack_fffffffffffffe80);
    local_58 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffed8,in_RDI,
                                   in_stack_fffffffffffffec8);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&local_10,local_28);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (in_RDI._M_current + 8));
    if (sVar4 < 0x10) {
      return true;
    }
    lrit::getHeader<lrit::PrimaryHeader>(in_stack_fffffffffffffeb0,iVar3);
    *(undefined8 *)(in_RDI._M_current + 0x60) = local_70;
    *(undefined8 *)(in_RDI._M_current + 0x68) = local_68;
    *(undefined8 *)(in_RDI._M_current + 0x70) = local_60;
  }
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            (ulong)*(uint *)(in_RDI._M_current + 0x68);
  pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      (in_RDI._M_current + 8));
  if (pvVar7 < this_00) {
    iVar3 = *(int *)(in_RDI._M_current + 0x68);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (in_RDI._M_current + 8));
    local_7c = iVar3 - (int)sVar4;
    dVar5 = __gnu_cxx::operator-
                      (in_stack_fffffffffffffe80,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffe78);
    local_80 = (uint)dVar5;
    puVar6 = std::min<unsigned_int>(&local_7c,&local_80);
    local_78 = (ulong)*puVar6;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe78);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_fffffffffffffe80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe78);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+(in_stack_fffffffffffffe88,(difference_type)in_stack_fffffffffffffe80);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (this_00,in_stack_fffffffffffffed8,in_RDI,in_stack_fffffffffffffec8);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&local_10,local_78);
    uVar1 = *(uint *)(in_RDI._M_current + 0x68);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (in_RDI._M_current + 8));
    if (sVar4 < uVar1) {
      return true;
    }
    bVar2 = completeHeader(in_stack_fffffffffffffef8);
    if (!bVar2) {
      return false;
    }
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x2deb7a);
  if (bVar2) {
    this_01 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2dec21);
    source = (void *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (in_RDI._M_current + 0x90));
    sourceLen = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator*(&local_10);
    param = (SZ_com_t *)
            __gnu_cxx::operator-
                      (in_stack_fffffffffffffe80,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffe78);
    if (param == (SZ_com_t *)0x0) {
      local_1 = true;
    }
    else {
      destLen = this_01;
      std::unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>::get
                ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)
                 in_stack_fffffffffffffe80);
      iVar3 = SZ_BufftoBuffDecompress
                        (in_stack_ffffffffffffff30,(size_t *)destLen,source,(size_t)sourceLen,param)
      ;
      if (iVar3 == 0) {
        this_02 = (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(in_RDI._M_current + 8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe78);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  (this_02,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffffe78);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe78)
        ;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe78)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+(this_01,(difference_type)this_02);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  (this_00,in_stack_fffffffffffffed8,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )in_RDI._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )in_stack_fffffffffffffec8._M_current);
        *(int *)(in_RDI._M_current + 0xa8) = *(int *)(in_RDI._M_current + 0xa8) + 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe78);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_fffffffffffffe80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe78);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (this_00,in_stack_fffffffffffffed8,in_RDI,in_stack_fffffffffffffec8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SessionPDU::append(
    std::vector<uint8_t>::const_iterator begin,
    std::vector<uint8_t>::const_iterator end) {
  // Copy primary header first so we can determine total header length
  if (buf_.size() < 16) {
    size_t len = std::min(
      uint32_t(16 - buf_.size()),
      uint32_t(end - begin));
    buf_.insert(buf_.end(), begin, begin + len);
    begin += len;
    if (buf_.size() < 16) {
      return true;
    }
    ph_ = lrit::getHeader<lrit::PrimaryHeader>(buf_, 0);
  }

  // Copy secondary headers verbatim
  if (ph_.totalHeaderLength > buf_.size()) {
    size_t len = std::min(
      uint32_t(ph_.totalHeaderLength - buf_.size()),
      uint32_t(end - begin));
    buf_.insert(buf_.end(), begin, begin + len);
    begin += len;
    if (ph_.totalHeaderLength > buf_.size()) {
      return true;
    }
    if (!completeHeader()) {
      return false;
    }
  }

  // Copy data verbatim if decompression parameters not set
  if (!szParam_) {
    buf_.insert(buf_.end(), begin, end);
    return true;
  }

  // Decompress otherwise
  uint8_t* out = szTmp_.data();
  size_t outLen = szTmp_.size();
  const uint8_t* dataIn = &(*begin);
  size_t dataInLen = end - begin;
  if (dataInLen == 0) {
    return true;
  }

  int rv = SZ_BufftoBuffDecompress(out, &outLen, dataIn, dataInLen, szParam_.get());
  if (rv != AEC_OK) {
    return false;
  }

  // Copy from temporary
  buf_.insert(buf_.end(), szTmp_.begin(), szTmp_.begin() + outLen);
  linesDone_++;
  return true;
}